

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

void __thiscall QTest::TestMethods::invokeTestOnData(TestMethods *this,int index)

{
  pointer pQVar1;
  double dVar2;
  long lVar3;
  QBenchmarkTestMethodData *pQVar4;
  qsizetype qVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  iterator iVar12;
  iterator iVar13;
  undefined8 extraout_RAX;
  long lVar14;
  byte bVar15;
  long lVar16;
  QBenchmarkResult *pQVar17;
  ulong uVar18;
  iterator __i;
  QList<QBenchmarkResult> *pQVar19;
  long in_FS_OFFSET;
  QLatin1String QVar20;
  QMetaMethod m;
  QByteArrayView QVar21;
  int local_b4;
  QArrayData *local_b0;
  longlong local_a8;
  QArrayDataPointer<QBenchmarkResult> local_98;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_78;
  QArrayDataPointer<QList<QBenchmarkResult>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[7])();
  local_b4 = -(uVar8 & 0xff);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QList<QBenchmarkResult> *)0x0;
  local_78.size = 0;
  uVar18 = (ulong)index;
  bVar15 = 0;
  do {
    QBenchmarkTestMethodData::beginDataRun(QBenchmarkTestMethodData::current);
    if (local_b4 < 0) {
      QBenchmarkTestMethodData::current->iterationCount = 1;
    }
    do {
      inTestFunction = 1;
      invokeTestMethodIfValid(this->m_initMethod,currentTestObject);
      bVar6 = QTestResult::skipCurrentTest();
      bVar7 = true;
      if (!bVar6) {
        bVar7 = QTestResult::currentTestFailed();
      }
      if (bVar7 == false) {
        QList<QBenchmarkResult>::clear(&QBenchmarkTestMethodData::current->results);
        pQVar4 = QBenchmarkTestMethodData::current;
        pQVar4->valid = false;
        pQVar4->resultAccepted = false;
        pcVar10 = QTestResult::currentDataTag();
        pcVar11 = "";
        if (pcVar10 != (char *)0x0) {
          pcVar11 = QTestResult::currentDataTag();
        }
        if (pcVar11 == (char *)0x0) {
          lVar16 = 0;
        }
        else {
          lVar14 = -1;
          do {
            lVar16 = lVar14 + 1;
            lVar3 = lVar14 + 1;
            lVar14 = lVar16;
          } while (pcVar11[lVar3] != '\0');
        }
        QVar20.m_data = pcVar11;
        QVar20.m_size = lVar16;
        QString::operator=(&(QBenchmarkGlobalData::current->context).tag,QVar20);
        pQVar1 = (this->m_methods).super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_methods).
                          super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pQVar1 >> 4) <= uVar18) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            invokeTestOnData();
            QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_58);
            QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_78);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(extraout_RAX);
            }
          }
          goto LAB_0012e381;
        }
        m.data.d = pQVar1[uVar18].data.d;
        m.mobj = pQVar1[uVar18].mobj;
        bVar6 = invokeTestMethodIfValid(m,currentTestObject);
        if (!bVar6) {
          QTestResult::addFailure
                    ("Unable to execute slot",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestcase.cpp"
                     ,0x41c);
        }
        bVar15 = QBenchmarkTestMethodData::current->valid;
      }
      else {
        bVar6 = false;
      }
      inTestFunction = 0;
      QTestResult::finishedCurrentTestData();
      if ((bVar7 == false) &&
         (invokeTestMethodIfValid(this->m_cleanupMethod,currentTestObject),
         QCoreApplication::self != 0)) {
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
      }
      if ((bVar15 & 1) == 0) {
        QTestResult::finishedCurrentTestDataCleanup();
      }
    } while (((((bVar6 & bVar15) == 1) &&
              (QBenchmarkTestMethodData::current->resultAccepted == false)) &&
             (bVar6 = QTestResult::skipCurrentTest(), !bVar6)) &&
            (bVar6 = QTestResult::currentTestFailed(), !bVar6));
    QBenchmarkTestMethodData::endDataRun(QBenchmarkTestMethodData::current);
    bVar6 = QTestResult::skipCurrentTest();
    if ((!bVar6) && (bVar6 = QTestResult::currentTestFailed(), !bVar6)) {
      if (-1 < local_b4) {
        QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>>::emplace<QList<QBenchmarkResult>const&>
                  ((QMovableArrayOps<QList<QBenchmarkResult>> *)&local_78,local_78.size,
                   &QBenchmarkTestMethodData::current->results);
        QList<QList<QBenchmarkResult>_>::end((QList<QList<QBenchmarkResult>_> *)&local_78);
      }
      if ((((bVar15 & 1) != 0) && (QBenchmarkGlobalData::current->verboseOutput == true)) &&
         ((QBenchmarkTestMethodData::current->results).d.size != 0)) {
        pQVar17 = (QBenchmarkTestMethodData::current->results).d.ptr;
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (QBenchmarkResult *)&DAT_aaaaaaaaaaaaaaaa;
        QVar21.m_data = (storage_type *)0x1d;
        QVar21.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar21);
        local_98.d = (Data *)local_58.d;
        local_98.ptr = (QBenchmarkResult *)local_58.ptr;
        local_98.size = local_58.size;
        QString::arg_impl((pQVar17->measurement).value,(int)&local_b0,(char)&local_98,0,(QChar)0x67)
        ;
        QString::toLocal8Bit_helper((QChar *)&local_58,local_a8);
        pQVar17 = (QBenchmarkResult *)local_58.ptr;
        if ((QBenchmarkResult *)local_58.ptr == (QBenchmarkResult *)0x0) {
          pQVar17 = (QBenchmarkResult *)&QByteArray::_empty;
        }
        QTestLog::info((char *)pQVar17,(char *)0x0,0);
        if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
          }
        }
        if (local_b0 != (QArrayData *)0x0) {
          LOCK();
          (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b0,2,0x10);
          }
        }
        if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (QBenchmarkGlobalData::current->minimumTotal == -1) {
      bVar6 = false;
    }
    else {
      iVar12 = QList<QList<QBenchmarkResult>_>::begin((QList<QList<QBenchmarkResult>_> *)&local_78);
      iVar13 = QList<QList<QBenchmarkResult>_>::end((QList<QList<QBenchmarkResult>_> *)&local_78);
      dVar2 = 0.0;
      for (; iVar12.i != iVar13.i; iVar12.i = iVar12.i + 1) {
        if (((iVar12.i)->d).size != 0) {
          dVar2 = dVar2 + ((((iVar12.i)->d).ptr)->measurement).value;
        }
      }
      bVar6 = dVar2 < (double)QBenchmarkGlobalData::current->minimumTotal;
    }
    if ((bVar15 & 1) == 0) goto LAB_0012e232;
    iVar9 = QBenchmarkGlobalData::adjustMedianIterationCount(QBenchmarkGlobalData::current);
    local_b4 = local_b4 + 1;
  } while (((local_b4 < iVar9 || bVar6) && (bVar6 = QTestResult::skipCurrentTest(), !bVar6)) &&
          (bVar6 = QTestResult::currentTestFailed(), !bVar6));
  bVar6 = QTestResult::skipCurrentTest();
  if (bVar6) {
    bVar6 = false;
  }
  else {
    bVar6 = QTestResult::currentTestFailed();
    bVar6 = !bVar6;
  }
  QTestResult::finishedCurrentTestDataCleanup();
  qVar5 = local_78.size;
  if ((bVar6) && (QBenchmarkTestMethodData::current->resultAccepted == true)) {
    iVar9 = (int)local_78.size;
    if (iVar9 == 1) {
      local_98.d = (Data *)(((QBenchmarkContext *)&(local_78.ptr)->d)->slotName).d.d;
      local_98.ptr = (QBenchmarkResult *)(((QBenchmarkContext *)&(local_78.ptr)->d)->slotName).d.ptr
      ;
      local_98.size = (((QBenchmarkContext *)&(local_78.ptr)->d)->slotName).d.size;
      if ((QArrayData *)local_98.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_98.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_98.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else if (iVar9 == 0) {
      local_98.d = (Data *)0x0;
      local_98.ptr = (QBenchmarkResult *)0x0;
      local_98.size = 0;
    }
    else {
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_58.size = local_78.size;
      if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar12 = QList<QList<QBenchmarkResult>_>::begin((QList<QList<QBenchmarkResult>_> *)&local_58);
      iVar13 = QList<QList<QBenchmarkResult>_>::end((QList<QList<QBenchmarkResult>_> *)&local_58);
      if (iVar12.i != iVar13.i) {
        uVar18 = ((long)iVar13.i - (long)iVar12.i >> 3) * -0x5555555555555555;
        lVar16 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QList<QBenchmarkResult>>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                  (iVar12.i,iVar13.i,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)iVar13.i - (long)iVar12.i < 0x181) {
          std::
          __insertion_sort<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                    (iVar12.i,iVar13.i);
        }
        else {
          pQVar19 = iVar12.i + 0x10;
          std::
          __insertion_sort<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                    (iVar12.i,pQVar19);
          for (; pQVar19 != iVar13.i; pQVar19 = pQVar19 + 1) {
            std::
            __unguarded_linear_insert<QList<QList<QBenchmarkResult>>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>>
                      (pQVar19);
          }
        }
      }
      iVar9 = (int)(((uint)((ulong)qVar5 >> 0x1f) & 1) + iVar9) >> 1;
      local_98.d = (&(local_58.ptr)->d)[iVar9].d;
      local_98.ptr = (&(local_58.ptr)->d)[iVar9].ptr;
      local_98.size = (&((QBenchmarkContext *)&(local_58.ptr)->d)->slotName)[iVar9].d.size;
      if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_58);
    }
    QTestLog::addBenchmarkResults((QList<QBenchmarkResult> *)&local_98);
    QArrayDataPointer<QBenchmarkResult>::~QArrayDataPointer(&local_98);
  }
LAB_0012e232:
  QArrayDataPointer<QList<QBenchmarkResult>_>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0012e381:
  __stack_chk_fail();
}

Assistant:

void TestMethods::invokeTestOnData(int index) const
{
    /* Benchmarking: for each median iteration*/

    bool isBenchmark = false;
    int i = (QBenchmarkGlobalData::current->measurer->needsWarmupIteration()) ? -1 : 0;

    QList<QList<QBenchmarkResult>> resultsList;
    bool minimumTotalReached = false;
    do {
        QBenchmarkTestMethodData::current->beginDataRun();
        if (i < 0)
            QBenchmarkTestMethodData::current->iterationCount = 1;

        /* Benchmarking: for each accumulation iteration*/
        bool invokeOk;
        do {
            QTest::inTestFunction = true;
            invokeTestMethodIfValid(m_initMethod);

            const bool initQuit =
                QTestResult::skipCurrentTest() || QTestResult::currentTestFailed();
            if (!initQuit) {
                QBenchmarkTestMethodData::current->results.clear();
                QBenchmarkTestMethodData::current->resultAccepted = false;
                QBenchmarkTestMethodData::current->valid = false;

                QBenchmarkGlobalData::current->context.tag = QLatin1StringView(
                    QTestResult::currentDataTag() ? QTestResult::currentDataTag() : "");

                invokeOk = invokeTestMethodIfValid(m_methods[index]);
                if (!invokeOk)
                    QTestResult::addFailure("Unable to execute slot", __FILE__, __LINE__);

                isBenchmark = QBenchmarkTestMethodData::current->isBenchmark();
            } else {
                invokeOk = false;
            }

            QTest::inTestFunction = false;
            QTestResult::finishedCurrentTestData();

            if (!initQuit) {
                invokeTestMethodIfValid(m_cleanupMethod);

                // Process any deleteLater(), used by event-loop-based apps.
                // Fixes memleak reports.
                if (QCoreApplication::instance())
                    QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);
            }
            // If the test isn't a benchmark, finalize the result after
            // cleanup() has finished (or init has lead us to skip the test).
            if (!isBenchmark)
                QTestResult::finishedCurrentTestDataCleanup();

            // If this test method has a benchmark, repeat until all measurements are
            // acceptable.
            // The QBENCHMARK macro increases the number of iterations for each run until
            // this happens.
        } while (invokeOk && isBenchmark
                 && QBenchmarkTestMethodData::current->resultsAccepted() == false
                 && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

        QBenchmarkTestMethodData::current->endDataRun();
        if (!QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed()) {
            if (i > -1)  // iteration -1 is the warmup iteration.
                resultsList.append(QBenchmarkTestMethodData::current->results);

            if (isBenchmark && QBenchmarkGlobalData::current->verboseOutput &&
                    !QBenchmarkTestMethodData::current->results.isEmpty()) {
                // we only print the first result
                const QBenchmarkResult &first = QBenchmarkTestMethodData::current->results.constFirst();
                QString pattern = i < 0 ? "warmup stage result      : %1"_L1
                                        : "accumulation stage result: %1"_L1;
                QTestLog::info(qPrintable(pattern.arg(first.measurement.value)), nullptr, 0);
            }
        }

        // Verify if the minimum total measurement (for the first measurement)
        // was reached, if it was specified:
        if (QBenchmarkGlobalData::current->minimumTotal == -1) {
            minimumTotalReached = true;
        } else {
            auto addResult = [](qreal current, const QList<QBenchmarkResult> &r) {
                if (!r.isEmpty())
                    current += r.first().measurement.value;
                return current;
            };
            const qreal total = std::accumulate(resultsList.begin(), resultsList.end(), 0.0, addResult);
            minimumTotalReached = (total >= QBenchmarkGlobalData::current->minimumTotal);
        }
    } while (isBenchmark
             && ((++i < QBenchmarkGlobalData::current->adjustMedianIterationCount()) || !minimumTotalReached)
             && !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed());

    // If the test is a benchmark, finalize the result after all iterations have finished.
    if (isBenchmark) {
        bool testPassed = !QTestResult::skipCurrentTest() && !QTestResult::currentTestFailed();
        QTestResult::finishedCurrentTestDataCleanup();
        // Only report benchmark figures if the test passed
        if (testPassed && QBenchmarkTestMethodData::current->resultsAccepted())
            QTestLog::addBenchmarkResults(qMedian(resultsList));
    }
}